

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O2

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
mnist::read_train(void)

{
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *in_RDI;
  string fn_images_train;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"train-images.idx3-ubyte",&local_31);
  read_images(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static std::vector<point_type> read_train() {
    std::string fn_images_train = "train-images.idx3-ubyte";
    return read_images(fn_images_train);
  }